

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int mllr_mat(float32 *****out_A,float32 ****out_B,char *var_fn,vector_t ***mean,vector_t ***wt_mean,
            float32 ***wt_dcount,uint32 gau_begin,int32 *cb2mllr,uint32 mllr_mult,uint32 mllr_add,
            float32 varfloor,uint32 n_mgau,uint32 n_stream,uint32 n_density,uint32 n_mllr_class,
            uint32 *veclen)

{
  size_t d2;
  uint uVar1;
  vector_t pfVar2;
  float32 ****ppppfVar3;
  float32 *pfVar4;
  float32 ****regr;
  int iVar5;
  uint uVar6;
  int32 iVar7;
  cmd_ln_t *cmdln;
  long lVar8;
  float32 *****regl;
  float32 ***pppfVar9;
  float32 **ppfVar10;
  char *fmt;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float32 *pfVar17;
  size_t d1;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  uint32 n_density_rd;
  uint32 n_stream_rd;
  uint32 n_mgau_rd;
  ulong local_c0;
  float32 *local_b8;
  uint32 *veclen_rd;
  vector_t ***var;
  float32 ****local_a0;
  uint local_94;
  float32 *local_90;
  vector_t ***local_88;
  float32 ***local_80;
  vector_t ***local_78;
  vector_t ****fullvar;
  float32 ***B;
  float32 ****A;
  float32 *****local_58;
  float32 ****local_50;
  ulong local_48;
  long local_40;
  vector_t ***local_38;
  
  local_b8 = (float32 *)CONCAT44(local_b8._4_4_,varfloor);
  var = (vector_t ***)0x0;
  A = (float32 ****)0x0;
  B = (float32 ***)0x0;
  veclen_rd = (uint32 *)0x0;
  local_88 = mean;
  local_80 = wt_dcount;
  local_78 = wt_mean;
  local_58 = out_A;
  local_50 = out_B;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x7f,"\n");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x80," ---- mllr_solve(): Conventional MLLR method\n");
  cmdln = cmd_ln_get();
  lVar8 = cmd_ln_int_r(cmdln,"-fullvar");
  if ((int)lVar8 == 0) {
    iVar5 = s3gau_read(var_fn,&var,&n_mgau_rd,&n_stream_rd,&n_density_rd,&veclen_rd);
    if (iVar5 != 0) {
      lVar8 = 0xa3;
      goto LAB_00102d52;
    }
  }
  else {
    iVar5 = s3gau_read_full(var_fn,&fullvar,&n_mgau_rd,&n_stream_rd,&n_density_rd,&veclen_rd);
    if (iVar5 != 0) {
      lVar8 = 0x8e;
LAB_00102d52:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,lVar8,"Couldn\'t read %s",var_fn);
      goto LAB_00102c9d;
    }
    var = gauden_alloc_param(n_mgau_rd,n_stream_rd,n_density_rd,veclen_rd);
    for (uVar12 = 0; uVar12 != n_mgau_rd; uVar12 = uVar12 + 1) {
      for (uVar14 = 0; uVar14 != n_stream_rd; uVar14 = uVar14 + 1) {
        for (uVar16 = 0; uVar16 != n_density_rd; uVar16 = uVar16 + 1) {
          uVar6 = veclen_rd[uVar14];
          for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
            var[uVar12][uVar14][uVar16][uVar18] = fullvar[uVar12][uVar14][uVar16][uVar18][uVar18];
          }
        }
      }
    }
    gauden_free_param_full(fullvar);
  }
  if (n_mgau_rd == n_mgau) {
    if (n_stream_rd == n_stream) {
      if (n_density_rd == n_density) {
        local_c0 = (ulong)n_stream;
        for (uVar12 = 0; local_c0 != uVar12; uVar12 = uVar12 + 1) {
          if (veclen[uVar12] != veclen_rd[uVar12]) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                    ,0xb3,"vector length of stream %u (== %u) != prior length (== %u)\n",uVar12,
                    (ulong)veclen_rd[uVar12],(ulong)veclen[uVar12]);
            goto LAB_00102c9d;
          }
        }
        ckd_free(veclen_rd);
        veclen_rd = (uint32 *)0x0;
        local_48 = (ulong)n_density;
        for (uVar12 = 0; uVar12 != n_mgau; uVar12 = uVar12 + 1) {
          for (uVar14 = 0; uVar14 != local_c0; uVar14 = uVar14 + 1) {
            for (uVar16 = 0; uVar16 != local_48; uVar16 = uVar16 + 1) {
              uVar6 = veclen[uVar14];
              for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
                fVar19 = var[uVar12][uVar14][uVar16][uVar18];
                fVar21 = 0.5;
                if ((0.0 < fVar19) && (fVar21 = 1.0 / local_b8._0_4_, local_b8._0_4_ <= fVar19)) {
                  fVar21 = 1.0 / fVar19;
                }
                var[uVar12][uVar14][uVar16][uVar18] = fVar21;
              }
            }
          }
        }
        fputc(10,_stderr);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0xd0," ---- A. Accum regl, regr\n");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0xd1," No classes %d, no. stream %d\n",(ulong)n_mllr_class,(ulong)n_stream);
        uVar12 = local_c0;
        pfVar17 = (float32 *)(ulong)n_mllr_class;
        regl = (float32 *****)
               __ckd_calloc_2d__((size_t)pfVar17,local_c0,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                 ,0xd4);
        local_90 = pfVar17;
        local_a0 = (float32 ****)
                   __ckd_calloc_2d__((size_t)pfVar17,uVar12,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                     ,0xd6);
        pfVar17 = (float32 *)0x0;
        while (regr = local_a0, pfVar17 != local_90) {
          local_b8 = pfVar17;
          for (uVar12 = 0; local_c0 != uVar12; uVar12 = uVar12 + 1) {
            d1 = (size_t)(int)veclen[uVar12];
            d2 = d1 + 1;
            pppfVar9 = (float32 ***)
                       __ckd_calloc_3d__(d1,d2,d2,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                         ,0xdb);
            pfVar17 = local_b8;
            regl[(long)local_b8][uVar12] = pppfVar9;
            ppfVar10 = (float32 **)
                       __ckd_calloc_2d__(d1,d2,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                         ,0xdc);
            local_a0[(long)pfVar17][uVar12] = ppfVar10;
          }
          pfVar17 = (float32 *)((long)local_b8 + 1);
        }
        while (uVar6 = gau_begin, uVar6 < n_mgau) {
          local_40 = (long)cb2mllr[uVar6];
          if (-1 < local_40) {
            for (uVar12 = 0; uVar12 != local_c0; uVar12 = uVar12 + 1) {
              uVar1 = veclen[uVar12];
              uVar16 = (ulong)uVar1;
              for (uVar14 = 0; uVar14 != local_48; uVar14 = uVar14 + 1) {
                local_b8 = local_80[uVar6][uVar12];
                if (0.0 < (float)local_b8[uVar14]) {
                  pfVar2 = local_88[uVar6][uVar12][uVar14];
                  local_38 = var;
                  for (uVar18 = 0; uVar18 != uVar16; uVar18 = uVar18 + 1) {
                    fVar19 = local_78[uVar6][uVar12][uVar14][uVar18] *
                             var[uVar6][uVar12][uVar14][uVar18];
                    fVar21 = var[uVar6][uVar12][uVar14][uVar18] * (float)local_b8[uVar14];
                    ppppfVar3 = regl[local_40];
                    ppfVar10 = ppppfVar3[uVar12][uVar18];
                    pfVar17 = local_a0[local_40][uVar12][uVar18];
                    uVar15 = 0;
                    while( true ) {
                      uVar13 = uVar16;
                      if (uVar16 < uVar15) {
                        uVar13 = uVar15;
                      }
                      if (uVar15 == uVar16) break;
                      fVar20 = pfVar2[uVar15] * fVar21;
                      for (uVar11 = uVar15; uVar13 != uVar11; uVar11 = uVar11 + 1) {
                        pfVar4 = ppfVar10[uVar15];
                        pfVar4[uVar11] = (float32)(pfVar2[uVar11] * fVar20 + (float)pfVar4[uVar11]);
                      }
                      pfVar4 = ppfVar10[uVar15];
                      pfVar4[(int)uVar1] = (float32)(fVar20 + (float)pfVar4[(int)uVar1]);
                      pfVar17[uVar15] = (float32)(pfVar2[uVar15] * fVar19 + (float)pfVar17[uVar15]);
                      uVar15 = uVar15 + 1;
                    }
                    pfVar4 = ppppfVar3[uVar12][uVar18][(int)uVar1];
                    pfVar4[(int)uVar1] = (float32)(fVar21 + (float)pfVar4[(int)uVar1]);
                    pfVar17[(int)uVar1] = (float32)(fVar19 + (float)pfVar17[(int)uVar1]);
                  }
                }
              }
            }
          }
          local_94 = uVar6;
          gau_begin = uVar6 + 1;
        }
        gauden_free_param(local_88);
        gauden_free_param(local_78);
        ckd_free_3d(local_80);
        for (pfVar17 = (float32 *)0x0; pfVar17 != local_90; pfVar17 = (float32 *)((long)pfVar17 + 1)
            ) {
          for (uVar12 = 0; uVar12 != local_c0; uVar12 = uVar12 + 1) {
            uVar6 = veclen[uVar12];
            for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
              uVar16 = 0;
              while (uVar18 = uVar16, uVar18 != uVar6 + 1) {
                for (uVar15 = uVar18 + 1 & 0xffffffff; uVar16 = uVar18 + 1, (uint)uVar15 <= uVar6;
                    uVar15 = (ulong)((uint)uVar15 + 1)) {
                  regl[(long)pfVar17][uVar12][uVar14][uVar15][uVar18] =
                       regl[(long)pfVar17][uVar12][uVar14][uVar18][uVar15];
                }
              }
            }
          }
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x119," ---- B. Compute MLLR matrices (A,B)\n");
        iVar7 = compute_mllr(regl,regr,veclen,n_mllr_class,n_stream,mllr_mult,mllr_add,&A,&B);
        if (iVar7 == 0) {
          free_mllr_reg(regl,regr,n_mllr_class,n_stream);
          *local_58 = A;
          *local_50 = B;
          return 0;
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0x123,"MLLR computation failed\n");
        goto LAB_00102c9d;
      }
      fmt = "n_density mismatch (%u : %u)\n";
      lVar8 = 0xae;
      uVar12 = (ulong)n_density;
    }
    else {
      fmt = "n_stream mismatch (%u : %u)\n";
      lVar8 = 0xab;
      uVar12 = (ulong)n_stream;
    }
  }
  else {
    fmt = "n_mgau mismatch (%u : %u)\n";
    lVar8 = 0xa8;
    uVar12 = (ulong)n_mgau;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,lVar8,fmt,uVar12);
LAB_00102c9d:
  exit(1);
}

Assistant:

int 
mllr_mat(float32 	*****out_A, 
      	float32 	****out_B, 
  	const char 	*var_fn, 
  	vector_t 	***mean, 
        vector_t        ***wt_mean,             /* read from bw accum */
	float32         ***wt_dcount,           /* read from bw accum */
  	uint32 		gau_begin, 
  	int32 		*cb2mllr, 
  	uint32 		mllr_mult,		
  	uint32 		mllr_add,		
  	float32		varfloor, 
  	uint32 		n_mgau, 
  	uint32 		n_stream, 
  	uint32 		n_density, 
  	uint32 		n_mllr_class, 
  	const uint32 	*veclen) 


{
      vector_t 	***var  	= NULL; 
      float32 	****A  		= NULL;		
      float32 	***B   		= NULL; 	

      float32 	*****regl  	= NULL; 
      float32 	****regr   	= NULL; 

      float32     wt_mean_var;
      float32     wt_dcount_var;
      float32     wt_dcount_var_mean;

      float32	*tmean		= NULL; 
      uint32 	n_mgau_rd; 
      uint32 	n_stream_rd; 
      uint32 	n_density_rd; 

      uint32    *veclen_rd	= NULL; 

      uint32 i, j, k, l, s, p , q;
      int32 m, mc;
      int32 len=0;

      /*      uint32 	i, j, k, l, p, q, s; 
	      int32	m, mc, mi; */

      E_INFO("\n");
      E_INFO(" ---- mllr_solve(): Conventional MLLR method\n"); 

      if (cmd_ln_int32("-fullvar")) {
	  /* Extract diagonals to solve MLLR (we are not doing
	     variance adaptation, yet) */
	  vector_t ****fullvar;
	  uint32 i, j, k, l;

	  if (s3gau_read_full(var_fn, 
			      &fullvar, 
			      &n_mgau_rd, 
			      &n_stream_rd, 
			      &n_density_rd, 
			      &veclen_rd) != S3_SUCCESS) { 
	      E_FATAL("Couldn't read %s", var_fn); 
	  } 
	  var = gauden_alloc_param(n_mgau_rd,
				   n_stream_rd,
				   n_density_rd,
				   veclen_rd);
	  for (i = 0; i < n_mgau_rd; ++i)
	      for (j = 0; j < n_stream_rd; ++j)
		  for (k = 0; k < n_density_rd; ++k)
		      for (l = 0; l < veclen_rd[j]; ++l)
			  var[i][j][k][l] =
			      fullvar[i][j][k][l][l];
	  gauden_free_param_full(fullvar);
      }
      else {
	  if (s3gau_read(var_fn, 
			 &var, 
			 &n_mgau_rd, 
			 &n_stream_rd, 
			 &n_density_rd, 
			 &veclen_rd) != S3_SUCCESS) { 
	      E_FATAL("Couldn't read %s", var_fn); 
	  } 
      }

      if (n_mgau != n_mgau_rd) { 
  	E_FATAL("n_mgau mismatch (%u : %u)\n",n_mgau,n_mgau_rd); 
      } 
      if (n_stream != n_stream_rd) { 
  	E_FATAL("n_stream mismatch (%u : %u)\n",n_stream,n_stream_rd); 
      } 
      if (n_density != n_density_rd) { 
  	E_FATAL("n_density mismatch (%u : %u)\n",n_density,n_density_rd); 
      } 
      for (s = 0; s < n_stream; s++) { 
  	if (veclen[s] != veclen_rd[s]) { 
  	    E_FATAL("vector length of stream %u (== %u) " 
  		    "!= prior length (== %u)\n", s, veclen_rd[s], veclen[s]); 
  	} 
      } 
      ckd_free((void *)veclen_rd); 
      veclen_rd = NULL; 


      /* Invert variances. */
      for (i = 0; i < n_mgau; i++) { 
          for (j = 0; j < n_stream; j++) { 
              for (k = 0; k < n_density; k++) { 
                  for (l = 0; l < veclen[j]; l++) { 
                      if (var[i][j][k][l] <= 0.) { 
  			var[i][j][k][l] = VAR_CONST;	
  		    } 
  		    else if (var[i][j][k][l] < varfloor) { 
  			var[i][j][k][l] = 1. / varfloor; 
  		    } 
  		    else { 
  		        var[i][j][k][l] = 1. / var[i][j][k][l]; 
  		    } 
                  } 
              } 
          } 
      } 


      fprintf(stderr,"\n"); 

      E_INFO(" ---- A. Accum regl, regr\n"); 
      E_INFO(" No classes %d, no. stream %d\n",n_mllr_class,n_stream);

      /* Legetter's set of G matrices, one per dimension per class. */
      regl = (float32 *****)ckd_calloc_2d(n_mllr_class, n_stream, sizeof(float32 ***)); 
      /* Legetter's Z matrices, one per class. */
      regr = (float32 ****) ckd_calloc_2d(n_mllr_class, n_stream, sizeof(float32 **)); 
      
      for (i = 0; i < n_mllr_class; i++) { 
          for (j = 0; j < n_stream; j++) { 
              len = veclen[j]; 
              regl[i][j] = (float32 ***)ckd_calloc_3d(len, len+1, len+1, sizeof(float32)); 
              regr[i][j] = (float32 **) ckd_calloc_2d(len, len+1, sizeof(float32)); 
          } 
      } 
      
      /*      E_INFO(" Checking\n");*/

      for (i = gau_begin; i < n_mgau; i++) { 
        mc = cb2mllr[i]; 
	if (mc < 0) continue;	/* skip */

        for (j = 0; j < n_stream; j++) { 
	  len=veclen[j];

	  for (k = 0; k < n_density; k++) { 
	    if (wt_dcount[i][j][k] > 0.) { 
	      tmean = mean[i][j][k]; 
	      for (l = 0; l < len; l++) { 
		wt_mean_var   = wt_mean[i][j][k][l] * var[i][j][k][l]; 
		wt_dcount_var = wt_dcount[i][j][k]  * var[i][j][k][l]; 
		
		for (p = 0; p < len; p++) { 
		  wt_dcount_var_mean = wt_dcount_var * tmean[p]; 
		  for (q = p; q < len; q++) { 
		    /* This is g(l)_{pq} = sum_r(v_{ii}(r) d_{pq}(r))*/
		    /* or in other words sum(likelihood * invvar * outer(mean, mean)) */
		    regl[mc][j][l][p][q] += (float32) (wt_dcount_var_mean * tmean[q]); 
		  } 
		  /* G corresponding to extended element of q. */
		  regl[mc][j][l][p][len] += (float32)(wt_dcount_var_mean); 
		  /* This is z_{lp} = sum(likelihood * invvar * obs * mean_p) */
		  regr[mc][j][l][p] += (float32)(wt_mean_var * tmean[p]); 
		} 
		/* G corresponding to extended element of p and q. */
		/* Question: what about regl[mc][j][l][len][0..len]? */
		/* Answer: G(l) is symmetric, so we already calculated them. */
		regl[mc][j][l][len][len] += (float32)wt_dcount_var; 
		/* Z corresponding to extended element of p. */
		regr[mc][j][l][len] += (float32)(wt_mean_var); 
	      } 
	    } 
	  } 
	} 
      }

      gauden_free_param(mean); 
      gauden_free_param(wt_mean); 
      ckd_free_3d((void ***)wt_dcount); 

      /* Fill in the lower triangular part of regl. */
      for (m = 0; m < n_mllr_class; m++) { 
        for (j = 0; j < n_stream; j++) { 
	  for (l = 0; l < veclen[j]; l++) { 
	    for (p = 0; p <= veclen[j]; p++) { 
	      for (q = p+1; q <= veclen[j]; q++) { 
		regl[m][j][l][q][p] = regl[m][j][l][p][q]; 
	      } 
	    } 
	  } 
        } 
      } 

      E_INFO(" ---- B. Compute MLLR matrices (A,B)\n"); 
      if(compute_mllr(regl, 
  		    regr, 
  		    veclen, 
  		    n_mllr_class, 
  		    n_stream, 
  		    mllr_mult, 
  		    mllr_add, 
  		    &A, 
  		    &B) != S3_SUCCESS) {  
  	E_FATAL("MLLR computation failed\n"); 
      } 

      free_mllr_reg(regl,regr, n_mllr_class, n_stream); 

      *out_A = A; 
      *out_B = B; 

      return S3_SUCCESS; 
}